

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O0

qint64 __thiscall
QHttpNetworkReplyPrivate::readStatus(QHttpNetworkReplyPrivate *this,QIODevice *socket)

{
  QByteArrayView status;
  QByteArrayView bv;
  bool bVar1;
  byte bVar2;
  storage_type *psVar3;
  qsizetype qVar4;
  char *in_RSI;
  storage_type *in_RDI;
  long in_FS_OFFSET;
  bool ok;
  qint64 haveRead;
  qint64 bytes;
  char c;
  undefined7 in_stack_ffffffffffffff78;
  char in_stack_ffffffffffffff7f;
  QByteArray *in_stack_ffffffffffffff80;
  QByteArray *in_stack_ffffffffffffff88;
  QByteArrayView *in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  qsizetype in_stack_ffffffffffffffa8;
  long local_50;
  long local_38;
  char local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QByteArray::isEmpty((QByteArray *)0x30533c);
  if (bVar1) {
    QByteArray::reserve((QByteArray *)in_stack_ffffffffffffff90,in_stack_ffffffffffffffa8);
  }
  local_50 = 0;
  local_9 = -0x56;
  do {
    psVar3 = (storage_type *)QIODevice::read(in_RSI,(longlong)&local_9);
    if (psVar3 == (storage_type *)0xffffffffffffffff) {
      local_38 = -1;
      goto LAB_0030556c;
    }
    if (psVar3 == (storage_type *)0x0) break;
    if (((psVar3 != (storage_type *)0x1) ||
        (qVar4 = QByteArray::size((QByteArray *)(in_RDI + 0x120)), qVar4 != 0)) ||
       (((local_9 != '\v' && (((local_9 != '\n' && (local_9 != '\r')) && (local_9 != ' ')))) &&
        (local_9 != '\x1f')))) {
      local_50 = local_50 + 1;
      if (local_9 == '\n') {
        bVar1 = QByteArray::endsWith(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
        if (bVar1) {
          in_stack_ffffffffffffff90 = (QByteArrayView *)(in_RDI + 0x120);
          QByteArray::size((QByteArray *)(in_RDI + 0x120));
          QByteArray::truncate((longlong)in_stack_ffffffffffffff90);
        }
        QByteArrayView::QByteArrayView<QByteArray,_true>
                  (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        status.m_data = in_RDI;
        status.m_size = (qsizetype)in_stack_ffffffffffffff90;
        bVar2 = parseStatus((QHttpNetworkReplyPrivate *)
                            CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),status);
        in_RDI[0xd0] = '\x02';
        in_RDI[0xd1] = '\0';
        in_RDI[0xd2] = '\0';
        in_RDI[0xd3] = '\0';
        QByteArray::clear();
        if ((bVar2 & 1) == 0) {
          local_38 = -1;
          goto LAB_0030556c;
        }
        break;
      }
      QByteArray::append((char)in_RDI + ' ');
      qVar4 = QByteArray::size((QByteArray *)(in_RDI + 0x120));
      if (qVar4 == 5) {
        in_stack_ffffffffffffff88 = (QByteArray *)(in_RDI + 0x120);
        QByteArrayView::QByteArrayView<6ul>
                  (in_stack_ffffffffffffff90,(char (*) [6])in_stack_ffffffffffffff88);
        bv.m_size._7_1_ = in_stack_ffffffffffffffa7;
        bv.m_size._0_7_ = in_stack_ffffffffffffffa0;
        bv.m_data = psVar3;
        bVar1 = QByteArray::startsWith(in_stack_ffffffffffffff88,bv);
        if (!bVar1) {
          QByteArray::clear();
          local_38 = -1;
          goto LAB_0030556c;
        }
      }
    }
  } while (psVar3 == (storage_type *)0x1);
  local_38 = local_50;
LAB_0030556c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_38;
}

Assistant:

qint64 QHttpNetworkReplyPrivate::readStatus(QIODevice *socket)
{
    if (fragment.isEmpty()) {
        // reserve bytes for the status line. This is better than always append() which reallocs the byte array
        fragment.reserve(32);
    }

    qint64 bytes = 0;
    char c;
    qint64 haveRead = 0;

    do {
        haveRead = socket->read(&c, 1);
        if (haveRead == -1)
            return -1; // unexpected EOF
        else if (haveRead == 0)
            break; // read more later
        else if (haveRead == 1 && fragment.size() == 0 && (c == 11 || c == '\n' || c == '\r' || c == ' ' || c == 31))
            continue; // Ignore all whitespace that was trailing froma previous request on that socket

        bytes++;

        // allow both CRLF & LF (only) line endings
        if (c == '\n') {
            // remove the CR at the end
            if (fragment.endsWith('\r')) {
                fragment.truncate(fragment.size()-1);
            }
            bool ok = parseStatus(fragment);
            state = ReadingHeaderState;
            fragment.clear();
            if (!ok) {
                return -1;
            }
            break;
        } else {
            fragment.append(c);
        }

        // is this a valid reply?
        if (fragment.size() == 5 && !fragment.startsWith("HTTP/")) {
            fragment.clear();
            return -1;
        }
    } while (haveRead == 1);

    return bytes;
}